

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_file_control(sqlite3 *db,char *zDbName,int op,void *pArg)

{
  Pager *pPVar1;
  sqlite3_file *psVar2;
  int iVar3;
  Btree *p;
  Pager *pPVar4;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p = sqlite3DbNameToBtree(db,zDbName);
  if (p == (Btree *)0x0) {
    iVar3 = 1;
    goto LAB_0012061b;
  }
  sqlite3BtreeEnter(p);
  pPVar1 = p->pBt->pPager;
  if (op == 0x1c) {
    pPVar4 = (Pager *)&pPVar1->jfd;
    if (pPVar1->pWal != (Wal *)0x0) {
      pPVar4 = (Pager *)&pPVar1->pWal->pWalFd;
    }
LAB_0012060b:
    *(sqlite3_vfs **)pArg = pPVar4->pVfs;
LAB_00120611:
    iVar3 = 0;
  }
  else {
    pPVar4 = pPVar1;
    if (op == 0x1b) goto LAB_0012060b;
    psVar2 = pPVar1->fd;
    if (op == 7) {
      *(sqlite3_file **)pArg = psVar2;
      goto LAB_00120611;
    }
    if (psVar2->pMethods == (sqlite3_io_methods *)0x0) {
      iVar3 = 0xc;
    }
    else {
      iVar3 = (*psVar2->pMethods->xFileControl)(psVar2,op,pArg);
    }
  }
  sqlite3BtreeLeave(p);
LAB_0012061b:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3_file_control(sqlite3 *db, const char *zDbName, int op, void *pArg){
  int rc = SQLITE_ERROR;
  Btree *pBtree;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  pBtree = sqlite3DbNameToBtree(db, zDbName);
  if( pBtree ){
    Pager *pPager;
    sqlite3_file *fd;
    sqlite3BtreeEnter(pBtree);
    pPager = sqlite3BtreePager(pBtree);
    assert( pPager!=0 );
    fd = sqlite3PagerFile(pPager);
    assert( fd!=0 );
    if( op==SQLITE_FCNTL_FILE_POINTER ){
      *(sqlite3_file**)pArg = fd;
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_VFS_POINTER ){
      *(sqlite3_vfs**)pArg = sqlite3PagerVfs(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_JOURNAL_POINTER ){
      *(sqlite3_file**)pArg = sqlite3PagerJrnlFile(pPager);
      rc = SQLITE_OK;
    }else if( fd->pMethods ){
      rc = sqlite3OsFileControl(fd, op, pArg);
    }else{
      rc = SQLITE_NOTFOUND;
    }
    sqlite3BtreeLeave(pBtree);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}